

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_cstring(basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
               *this,string_type *buffer,error_code *ec)

{
  uchar *puVar1;
  size_t *psVar2;
  ulong uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  bool bVar7;
  uint8_t c;
  uchar local_21;
  
  local_21 = 0xff;
  puVar4 = (this->source_).current_._M_current;
  bVar7 = (this->source_).end_._M_current != puVar4;
  uVar3 = (ulong)bVar7;
  if (bVar7) {
    puVar5 = puVar4 + uVar3;
    puVar6 = &local_21;
    do {
      do {
        puVar1 = puVar4 + 1;
        (this->source_).current_._M_current = puVar1;
        *puVar6 = *puVar4;
        puVar4 = puVar1;
        puVar6 = puVar6 + 1;
      } while (puVar1 != puVar5);
      psVar2 = &(this->source_).position_;
      *psVar2 = *psVar2 + uVar3;
      psVar2 = &(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
      *psVar2 = *psVar2 + uVar3;
      if ((char)uVar3 == '\0') goto LAB_0024f1e4;
      if (local_21 == '\0') {
        return;
      }
      std::__cxx11::string::push_back((char)buffer);
      puVar4 = (this->source_).current_._M_current;
      puVar1 = (this->source_).end_._M_current;
      uVar3 = (ulong)(puVar1 != puVar4);
      puVar5 = puVar4 + uVar3;
      puVar6 = &local_21;
    } while (puVar1 != puVar4);
  }
  psVar2 = &(this->source_).position_;
  *psVar2 = *psVar2 + uVar3;
  psVar2 = &(this->state_stack_).
            super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
  *psVar2 = *psVar2 + uVar3;
LAB_0024f1e4:
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
  return;
}

Assistant:

void read_cstring(string_type& buffer, std::error_code& ec)
    {
        uint8_t c = 0xff;
        while (true)
        {
            std::size_t n = source_.read(&c, 1);
            state_stack_.back().pos += n;
            if (JSONCONS_UNLIKELY(n != 1))
            {
                ec = bson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c == 0)
            {
                break;
            }
            buffer.push_back(c);
        }
    }